

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int diffie_hellman_sha1(LIBSSH2_SESSION *session,BIGNUM *g,BIGNUM *p,int group_order,
                       uchar packet_type_init,uchar packet_type_reply,uchar *midhash,
                       unsigned_long midhash_len,kmdhgGPshakex_state_t *exchange_state)

{
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var1;
  LIBSSH2_COMP_METHOD *pLVar2;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  EVP_MD_CTX *ctx;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  BN_CTX *pBVar11;
  BIGNUM *pBVar12;
  uchar *puVar13;
  size_t sVar14;
  uchar *puVar15;
  LIBSSH2_CRYPT_METHOD *pLVar16;
  _LIBSSH2_MAC_METHOD *p_Var17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  uchar *puVar21;
  EVP_MD_CTX *ctx_00;
  undefined7 in_register_00000081;
  EVP_MD_CTX *hash;
  EVP_MD_CTX *exchange_hash_ctx;
  int local_44;
  int free_iv;
  int free_secret;
  uchar *local_38;
  
  local_38 = (uchar *)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000081,packet_type_init));
  if (exchange_state->state == libssh2_NB_state_idle) {
    exchange_state->k_value = (uchar *)0x0;
    exchange_state->e_packet = (uchar *)0x0;
    exchange_state->s_packet = (uchar *)0x0;
    pBVar11 = BN_CTX_new();
    exchange_state->ctx = (BN_CTX *)pBVar11;
    pBVar12 = BN_new();
    exchange_state->x = (BIGNUM *)pBVar12;
    pBVar12 = BN_new();
    exchange_state->e = (BIGNUM *)pBVar12;
    pBVar12 = BN_new();
    exchange_state->f = (BIGNUM *)pBVar12;
    pBVar12 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar12;
    *(undefined8 *)&exchange_state->req_state = 0;
    (exchange_state->req_state).start = 0;
    BN_rand((BIGNUM *)exchange_state->x,group_order * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)exchange_state->e,(BIGNUM *)g,(BIGNUM *)exchange_state->x,(BIGNUM *)p,
               (BN_CTX *)exchange_state->ctx);
    iVar6 = BN_num_bits((BIGNUM *)exchange_state->e);
    iVar8 = iVar6 + 0xe;
    if (-1 < iVar6 + 7) {
      iVar8 = iVar6 + 7;
    }
    exchange_state->e_packet_len = (long)((iVar8 >> 3) + 6);
    uVar7 = BN_num_bits((BIGNUM *)exchange_state->e);
    if ((uVar7 & 7) != 0) {
      exchange_state->e_packet_len = exchange_state->e_packet_len - 1;
    }
    puVar13 = (uchar *)(*session->alloc)(exchange_state->e_packet_len,&session->abstract);
    exchange_state->e_packet = puVar13;
    if (puVar13 != (uchar *)0x0) {
      *puVar13 = (uchar)local_38;
      _libssh2_htonu32(exchange_state->e_packet + 1,(int)exchange_state->e_packet_len - 5);
      uVar7 = BN_num_bits((BIGNUM *)exchange_state->e);
      lVar20 = 5;
      if ((uVar7 & 7) == 0) {
        exchange_state->e_packet[5] = '\0';
        lVar20 = 6;
      }
      BN_bn2bin((BIGNUM *)exchange_state->e,exchange_state->e_packet + lVar20);
      exchange_state->state = libssh2_NB_state_created;
      goto LAB_00122d2e;
    }
    pcVar18 = "Out of memory error";
    goto LAB_00122dae;
  }
LAB_00122d2e:
  if (exchange_state->state == libssh2_NB_state_created) {
    iVar8 = _libssh2_transport_send
                      (session,exchange_state->e_packet,exchange_state->e_packet_len,(uchar *)0x0,0)
    ;
    if (iVar8 == -0x25) {
      return -0x25;
    }
    if (iVar8 == 0) {
      exchange_state->state = libssh2_NB_state_sent;
      goto LAB_00122d61;
    }
    pcVar18 = "Unable to send KEX init message";
  }
  else {
LAB_00122d61:
    iVar6 = 0;
    if (exchange_state->state == libssh2_NB_state_sent) {
      iVar6 = 0;
      if ((session->field_0x80 & 1) != 0) {
        iVar8 = _libssh2_packet_burn(session,&exchange_state->burn_state);
        if (iVar8 == -0x25) {
          iVar9 = 1;
          iVar6 = 0;
        }
        else if (iVar8 < 1) {
          iVar9 = 2;
          iVar6 = iVar8;
        }
        else {
          session->field_0x80 = session->field_0x80 & 0xfe;
          iVar9 = 0;
          iVar6 = 0;
        }
        iVar10 = iVar6;
        if (iVar9 == 2) goto LAB_00123cbe;
        if (iVar9 != 0) {
          return iVar8;
        }
      }
      exchange_state->state = libssh2_NB_state_sent1;
    }
    if (exchange_state->state != libssh2_NB_state_sent1) {
LAB_0012339b:
      if (exchange_state->state == libssh2_NB_state_sent2) {
        iVar8 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
        if (iVar8 == -0x25) {
          return -0x25;
        }
        if (iVar8 != 0) {
          pcVar18 = "Unable to send NEWKEYS message";
          goto LAB_0012369c;
        }
        exchange_state->state = libssh2_NB_state_sent3;
      }
      iVar10 = iVar6;
      if (exchange_state->state != libssh2_NB_state_sent3) goto LAB_00123cbe;
      iVar8 = _libssh2_packet_require
                        (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,(uchar *)0x0
                         ,0,&exchange_state->req_state);
      if (iVar8 == -0x25) {
        return -0x25;
      }
      if (iVar8 != 0) {
        pcVar18 = "Timed out waiting for NEWKEYS";
        goto LAB_0012369c;
      }
      *(byte *)&session->state = (byte)session->state | 2;
      (*session->free)(exchange_state->tmp,&session->abstract);
      if (session->session_id == (uchar *)0x0) {
        puVar13 = (uchar *)(*session->alloc)(0x14,&session->abstract);
        session->session_id = puVar13;
        if (puVar13 == (uchar *)0x0) {
          pcVar18 = "Unable to allocate buffer for SHA digest";
          goto LAB_00122dae;
        }
        *(undefined4 *)(puVar13 + 0x10) = *(undefined4 *)(exchange_state->h_sig_comp + 0x10);
        uVar4 = *(undefined8 *)(exchange_state->h_sig_comp + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)exchange_state->h_sig_comp;
        *(undefined8 *)(puVar13 + 8) = uVar4;
        session->session_id_len = 0x14;
      }
      p_Var1 = ((session->local).crypt)->dtor;
      if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var1)(session,&(session->local).crypt_abstract);
      }
      pLVar16 = (session->local).crypt;
      if (pLVar16->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        free_iv = 0;
        free_secret = 0;
        puVar13 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x14,&session->abstract);
        if (puVar13 == (uchar *)0x0) {
          iVar6 = -1;
LAB_001236cc:
          bVar5 = false;
        }
        else {
          pLVar16 = (session->local).crypt;
          local_44 = iVar6;
          if (pLVar16->iv_len != 0) {
            sVar14 = 0;
            do {
              _libssh2_sha1_init(&hash);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                               exchange_state->k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
              uVar19 = sVar14;
              puVar15 = puVar13;
              if (sVar14 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                uVar19 = (ulong)session->session_id_len;
                puVar15 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar19);
              EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar14,(uint *)0x0);
              EVP_MD_CTX_free(hash);
              sVar14 = sVar14 + 0x14;
              pLVar16 = (session->local).crypt;
            } while (sVar14 < (ulong)(long)pLVar16->iv_len);
          }
          if (puVar13 != (uchar *)0x0) {
            puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x14,&session->abstract
                                                );
            if (puVar15 != (uchar *)0x0) {
              pLVar16 = (session->local).crypt;
              if (pLVar16->secret_len != 0) {
                sVar14 = 0;
                do {
                  _libssh2_sha1_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                   exchange_state->k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                  uVar19 = sVar14;
                  puVar21 = puVar15;
                  if (sVar14 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                    uVar19 = (ulong)session->session_id_len;
                    puVar21 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar19);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar15 + sVar14,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar14 = sVar14 + 0x14;
                  pLVar16 = (session->local).crypt;
                } while (sVar14 < (ulong)(long)pLVar16->secret_len);
              }
              if (puVar15 != (uchar *)0x0) {
                iVar8 = (*pLVar16->init)(session,pLVar16,puVar13,&free_iv,puVar15,&free_secret,1,
                                         &(session->local).crypt_abstract);
                if (iVar8 == 0) {
                  if (free_iv != 0) {
                    memset(puVar13,0,(long)((session->local).crypt)->iv_len);
                    (*session->free)(puVar13,&session->abstract);
                  }
                  iVar6 = local_44;
                  bVar5 = true;
                  if (free_secret != 0) {
                    memset(puVar15,0,(long)((session->local).crypt)->secret_len);
                    (*session->free)(puVar15,&session->abstract);
                  }
                  goto LAB_001236d8;
                }
                (*session->free)(puVar13,&session->abstract);
                puVar13 = puVar15;
              }
            }
            (*session->free)(puVar13,&session->abstract);
            iVar6 = -5;
            goto LAB_001236cc;
          }
          bVar5 = false;
          iVar6 = -1;
        }
LAB_001236d8:
        iVar10 = iVar6;
        if (!bVar5) goto LAB_00123cbe;
      }
      p_Var1 = ((session->remote).crypt)->dtor;
      if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var1)(session,&(session->remote).crypt_abstract);
      }
      pLVar16 = (session->remote).crypt;
      if (pLVar16->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        free_iv = 0;
        free_secret = 0;
        local_44 = iVar6;
        puVar13 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x14,&session->abstract);
        if (puVar13 == (uchar *)0x0) {
LAB_0012391d:
          bVar5 = false;
          iVar6 = -5;
        }
        else {
          pLVar16 = (session->remote).crypt;
          if (pLVar16->iv_len != 0) {
            sVar14 = 0;
            do {
              _libssh2_sha1_init(&hash);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                               exchange_state->k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
              uVar19 = sVar14;
              puVar15 = puVar13;
              if (sVar14 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                uVar19 = (ulong)session->session_id_len;
                puVar15 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar19);
              EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar14,(uint *)0x0);
              EVP_MD_CTX_free(hash);
              sVar14 = sVar14 + 0x14;
              pLVar16 = (session->remote).crypt;
            } while (sVar14 < (ulong)(long)pLVar16->iv_len);
          }
          if (puVar13 == (uchar *)0x0) goto LAB_0012391d;
          puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x14,&session->abstract);
          if (puVar15 == (uchar *)0x0) {
LAB_00123917:
            (*session->free)(puVar13,&session->abstract);
            goto LAB_0012391d;
          }
          pLVar16 = (session->remote).crypt;
          if (pLVar16->secret_len != 0) {
            local_38 = exchange_state->h_sig_comp;
            sVar14 = 0;
            do {
              _libssh2_sha1_init(&hash);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                               exchange_state->k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,local_38,0x14);
              uVar19 = sVar14;
              puVar21 = puVar15;
              if (sVar14 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                uVar19 = (ulong)session->session_id_len;
                puVar21 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar19);
              EVP_DigestFinal((EVP_MD_CTX *)hash,puVar15 + sVar14,(uint *)0x0);
              EVP_MD_CTX_free(hash);
              sVar14 = sVar14 + 0x14;
              pLVar16 = (session->remote).crypt;
            } while (sVar14 < (ulong)(long)pLVar16->secret_len);
          }
          if (puVar15 == (uchar *)0x0) goto LAB_00123917;
          iVar8 = (*pLVar16->init)(session,pLVar16,puVar13,&free_iv,puVar15,&free_secret,0,
                                   &(session->remote).crypt_abstract);
          if (iVar8 != 0) {
            (*session->free)(puVar13,&session->abstract);
            puVar13 = puVar15;
            goto LAB_00123917;
          }
          if (free_iv != 0) {
            memset(puVar13,0,(long)((session->remote).crypt)->iv_len);
            (*session->free)(puVar13,&session->abstract);
          }
          bVar5 = true;
          iVar6 = local_44;
          if (free_secret != 0) {
            memset(puVar15,0,(long)((session->remote).crypt)->secret_len);
            (*session->free)(puVar15,&session->abstract);
            iVar6 = local_44;
          }
        }
        iVar10 = iVar6;
        if (!bVar5) goto LAB_00123cbe;
      }
      p_Var1 = ((session->local).mac)->dtor;
      if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var1)(session,&(session->local).mac_abstract);
      }
      p_Var17 = (session->local).mac;
      if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        free_iv = 0;
        puVar13 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x14,&session->abstract);
        if (puVar13 == (uchar *)0x0) {
          bVar5 = false;
          iVar6 = -5;
        }
        else {
          p_Var17 = (session->local).mac;
          local_44 = iVar6;
          if (p_Var17->key_len != 0) {
            sVar14 = 0;
            do {
              _libssh2_sha1_init(&hash);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                               exchange_state->k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
              uVar19 = sVar14;
              puVar15 = puVar13;
              if (sVar14 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                uVar19 = (ulong)session->session_id_len;
                puVar15 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar19);
              EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar14,(uint *)0x0);
              EVP_MD_CTX_free(hash);
              sVar14 = sVar14 + 0x14;
              p_Var17 = (session->local).mac;
            } while (sVar14 < (ulong)(long)p_Var17->key_len);
          }
          if (puVar13 == (uchar *)0x0) {
            bVar5 = false;
            iVar6 = -5;
          }
          else {
            (*p_Var17->init)(session,puVar13,&free_iv,&(session->local).mac_abstract);
            bVar5 = true;
            iVar6 = local_44;
            if (free_iv != 0) {
              memset(puVar13,0,(long)((session->local).mac)->key_len);
              (*session->free)(puVar13,&session->abstract);
              iVar6 = local_44;
            }
          }
        }
        iVar10 = iVar6;
        if (!bVar5) goto LAB_00123cbe;
      }
      p_Var1 = ((session->remote).mac)->dtor;
      if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var1)(session,&(session->remote).mac_abstract);
      }
      p_Var17 = (session->remote).mac;
      if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        free_iv = 0;
        puVar13 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x14,&session->abstract);
        if (puVar13 == (uchar *)0x0) {
          bVar5 = false;
          iVar6 = -5;
        }
        else {
          p_Var17 = (session->remote).mac;
          local_44 = iVar6;
          if (p_Var17->key_len != 0) {
            sVar14 = 0;
            do {
              _libssh2_sha1_init(&hash);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                               exchange_state->k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
              uVar19 = sVar14;
              puVar15 = puVar13;
              if (sVar14 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                uVar19 = (ulong)session->session_id_len;
                puVar15 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar19);
              EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar14,(uint *)0x0);
              EVP_MD_CTX_free(hash);
              sVar14 = sVar14 + 0x14;
              p_Var17 = (session->remote).mac;
            } while (sVar14 < (ulong)(long)p_Var17->key_len);
          }
          if (puVar13 == (uchar *)0x0) {
            bVar5 = false;
            iVar6 = -5;
          }
          else {
            (*p_Var17->init)(session,puVar13,&free_iv,&(session->remote).mac_abstract);
            bVar5 = true;
            iVar6 = local_44;
            if (free_iv != 0) {
              memset(puVar13,0,(long)((session->remote).mac)->key_len);
              (*session->free)(puVar13,&session->abstract);
              iVar6 = local_44;
            }
          }
        }
        iVar10 = iVar6;
        if (!bVar5) goto LAB_00123cbe;
      }
      pLVar2 = (session->local).comp;
      if ((pLVar2 != (LIBSSH2_COMP_METHOD *)0x0) &&
         (p_Var3 = pLVar2->dtor, p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
        (*p_Var3)(session,1,&(session->local).comp_abstract);
      }
      pLVar2 = (session->local).comp;
      if ((pLVar2 != (LIBSSH2_COMP_METHOD *)0x0) &&
         (p_Var3 = pLVar2->init, p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
        iVar8 = (*p_Var3)(session,1,&(session->local).comp_abstract);
        iVar10 = -5;
        if (iVar8 != 0) goto LAB_00123cbe;
      }
      pLVar2 = (session->remote).comp;
      if ((pLVar2 != (LIBSSH2_COMP_METHOD *)0x0) &&
         (p_Var3 = pLVar2->dtor, p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
        (*p_Var3)(session,0,&(session->remote).comp_abstract);
      }
      pLVar2 = (session->remote).comp;
      iVar10 = iVar6;
      if ((pLVar2 != (LIBSSH2_COMP_METHOD *)0x0) &&
         (p_Var3 = pLVar2->init, p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
        iVar8 = (*p_Var3)(session,0,&(session->remote).comp_abstract);
        iVar10 = -5;
        if (iVar8 == 0) {
          iVar10 = iVar6;
        }
      }
      goto LAB_00123cbe;
    }
    iVar8 = _libssh2_packet_require
                      (session,packet_type_reply,&exchange_state->s_packet,
                       &exchange_state->s_packet_len,0,(uchar *)0x0,0,&exchange_state->req_state);
    if (iVar8 == -0x25) {
      return -0x25;
    }
    if (iVar8 == 0) {
      exchange_state->s = exchange_state->s_packet + 1;
      uVar7 = _libssh2_ntohu32(exchange_state->s_packet + 1);
      session->server_hostkey_len = uVar7;
      exchange_state->s = exchange_state->s + 4;
      if (session->server_hostkey != (uchar *)0x0) {
        (*session->free)(session->server_hostkey,&session->abstract);
      }
      puVar13 = (uchar *)(*session->alloc)((ulong)session->server_hostkey_len,&session->abstract);
      session->server_hostkey = puVar13;
      if (puVar13 == (uchar *)0x0) {
        pcVar18 = "Unable to allocate memory for a copy of the host key";
LAB_00122dae:
        iVar8 = -6;
      }
      else {
        memcpy(puVar13,exchange_state->s,(ulong)session->server_hostkey_len);
        exchange_state->s = exchange_state->s + session->server_hostkey_len;
        iVar8 = _libssh2_md5_init(&exchange_hash_ctx);
        if (iVar8 != 0) {
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len);
          EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_md5,(uint *)0x0);
          EVP_MD_CTX_free(exchange_hash_ctx);
        }
        session->server_hostkey_md5_valid = (uint)(iVar8 != 0);
        iVar8 = _libssh2_sha1_init(&exchange_hash_ctx);
        if (iVar8 != 0) {
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len);
          EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_sha1,(uint *)0x0);
          EVP_MD_CTX_free(exchange_hash_ctx);
        }
        session->server_hostkey_sha1_valid = (uint)(iVar8 != 0);
        iVar8 = (*session->hostkey->init)
                          (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                           &session->server_hostkey_abstract);
        if (iVar8 == 0) {
          uVar7 = _libssh2_ntohu32(exchange_state->s);
          exchange_state->f_value_len = (ulong)uVar7;
          puVar13 = exchange_state->s + 4;
          exchange_state->f_value = puVar13;
          exchange_state->s = exchange_state->s + (ulong)uVar7 + 4;
          BN_bin2bn(puVar13,uVar7,(BIGNUM *)exchange_state->f);
          uVar7 = _libssh2_ntohu32(exchange_state->s);
          exchange_state->h_sig_len = (ulong)uVar7;
          puVar13 = exchange_state->s;
          exchange_state->s = puVar13 + 4;
          exchange_state->h_sig = puVar13 + 4;
          BN_mod_exp((BIGNUM *)exchange_state->k,(BIGNUM *)exchange_state->f,
                     (BIGNUM *)exchange_state->x,(BIGNUM *)p,(BN_CTX *)exchange_state->ctx);
          iVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
          iVar8 = iVar9 + 0xe;
          if (-1 < iVar9 + 7) {
            iVar8 = iVar9 + 7;
          }
          exchange_state->k_value_len = (long)((iVar8 >> 3) + 5);
          uVar7 = BN_num_bits((BIGNUM *)exchange_state->k);
          if ((uVar7 & 7) != 0) {
            exchange_state->k_value_len = exchange_state->k_value_len - 1;
          }
          puVar13 = (uchar *)(*session->alloc)(exchange_state->k_value_len,&session->abstract);
          exchange_state->k_value = puVar13;
          if (puVar13 == (uchar *)0x0) {
            pcVar18 = "Unable to allocate buffer for K";
            goto LAB_00122dae;
          }
          _libssh2_htonu32(puVar13,(int)exchange_state->k_value_len - 4);
          uVar7 = BN_num_bits((BIGNUM *)exchange_state->k);
          lVar20 = 4;
          if ((uVar7 & 7) == 0) {
            exchange_state->k_value[4] = '\0';
            lVar20 = 5;
          }
          local_44 = iVar6;
          BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + lVar20);
          exchange_state->exchange_hash = &exchange_hash_ctx;
          _libssh2_sha1_init(&exchange_hash_ctx);
          puVar15 = (session->local).banner;
          puVar13 = exchange_state->h_sig_comp;
          if (puVar15 == (uchar *)0x0) {
            _libssh2_htonu32(puVar13,0x15);
            EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
            pcVar18 = "SSH-2.0-libssh2_1.8.0";
            sVar14 = 0x15;
            ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
          }
          else {
            sVar14 = strlen((char *)puVar15);
            _libssh2_htonu32(puVar13,(int)sVar14 - 2);
            EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
            ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
            pcVar18 = (char *)(session->local).banner;
            sVar14 = strlen(pcVar18);
            sVar14 = sVar14 - 2;
          }
          EVP_DigestUpdate(ctx_00,pcVar18,sVar14);
          sVar14 = strlen((char *)(session->remote).banner);
          _libssh2_htonu32(puVar13,(uint32_t)sVar14);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
          ctx = exchange_hash_ctx;
          puVar15 = (session->remote).banner;
          sVar14 = strlen((char *)puVar15);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar15,sVar14);
          _libssh2_htonu32(puVar13,(uint32_t)(session->local).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->local).kexinit,
                           (session->local).kexinit_len);
          _libssh2_htonu32(puVar13,(uint32_t)(session->remote).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->remote).kexinit,
                           (session->remote).kexinit_len);
          _libssh2_htonu32(puVar13,session->server_hostkey_len);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len);
          if ((char)local_38 == ' ') {
            _libssh2_htonu32(puVar13,0x400);
            _libssh2_htonu32(exchange_state->h_sig_comp + 4,0x600);
            _libssh2_htonu32(exchange_state->h_sig_comp + 8,0x800);
            EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,0xc);
          }
          iVar6 = local_44;
          if (midhash != (uchar *)0x0) {
            EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,midhash,midhash_len);
          }
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->e_packet + 1,
                           exchange_state->e_packet_len - 1);
          _libssh2_htonu32(puVar13,(uint32_t)exchange_state->f_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar13,4);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->f_value,
                           exchange_state->f_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->k_value,
                           exchange_state->k_value_len);
          EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,puVar13,(uint *)0x0);
          EVP_MD_CTX_free(exchange_hash_ctx);
          iVar8 = (*session->hostkey->sig_verify)
                            (session,exchange_state->h_sig,exchange_state->h_sig_len,puVar13,0x14,
                             &session->server_hostkey_abstract);
          if (iVar8 == 0) {
            exchange_state->c = '\x15';
            exchange_state->state = libssh2_NB_state_sent2;
            goto LAB_0012339b;
          }
          pcVar18 = "Unable to verify hostkey signature";
          iVar8 = -0xb;
        }
        else {
          pcVar18 = "Unable to initialize hostkey importer";
          iVar8 = -10;
        }
      }
    }
    else {
      pcVar18 = "Timed out waiting for KEX reply";
      iVar8 = -9;
    }
  }
LAB_0012369c:
  iVar10 = _libssh2_error(session,iVar8,pcVar18);
LAB_00123cbe:
  BN_clear_free((BIGNUM *)exchange_state->x);
  exchange_state->x = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->e);
  exchange_state->e = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->f);
  exchange_state->f = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  BN_CTX_free((BN_CTX *)exchange_state->ctx);
  exchange_state->ctx = (BN_CTX *)0x0;
  if (exchange_state->e_packet != (uchar *)0x0) {
    (*session->free)(exchange_state->e_packet,&session->abstract);
    exchange_state->e_packet = (uchar *)0x0;
  }
  if (exchange_state->s_packet != (uchar *)0x0) {
    (*session->free)(exchange_state->s_packet,&session->abstract);
    exchange_state->s_packet = (uchar *)0x0;
  }
  if (exchange_state->k_value != (uchar *)0x0) {
    (*session->free)(exchange_state->k_value,&session->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return iVar10;
}

Assistant:

static int diffie_hellman_sha1(LIBSSH2_SESSION *session,
                               _libssh2_bn *g,
                               _libssh2_bn *p,
                               int group_order,
                               unsigned char packet_type_init,
                               unsigned char packet_type_reply,
                               unsigned char *midhash,
                               unsigned long midhash_len,
                               kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;
    libssh2_sha1_ctx exchange_hash_ctx;

    if (exchange_state->state == libssh2_NB_state_idle) {
        /* Setup initial values */
        exchange_state->e_packet = NULL;
        exchange_state->s_packet = NULL;
        exchange_state->k_value = NULL;
        exchange_state->ctx = _libssh2_bn_ctx_new();
        exchange_state->x = _libssh2_bn_init(); /* Random from client */
        exchange_state->e = _libssh2_bn_init(); /* g^x mod p */
        exchange_state->f = _libssh2_bn_init_from_bin(); /* g^(Random from server) mod p */
        exchange_state->k = _libssh2_bn_init(); /* The shared secret: f^x mod p */

        /* Zero the whole thing out */
        memset(&exchange_state->req_state, 0, sizeof(packet_require_state_t));

        /* Generate x and e */
        _libssh2_bn_rand(exchange_state->x, group_order * 8 - 1, 0, -1);
        _libssh2_bn_mod_exp(exchange_state->e, g, exchange_state->x, p,
                            exchange_state->ctx);

        /* Send KEX init */
        /* packet_type(1) + String Length(4) + leading 0(1) */
        exchange_state->e_packet_len =
            _libssh2_bn_bytes(exchange_state->e) + 6;
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            /* Leading 00 not needed */
            exchange_state->e_packet_len--;
        }

        exchange_state->e_packet =
            LIBSSH2_ALLOC(session, exchange_state->e_packet_len);
        if (!exchange_state->e_packet) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Out of memory error");
            goto clean_exit;
        }
        exchange_state->e_packet[0] = packet_type_init;
        _libssh2_htonu32(exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 5);
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 5);
        } else {
            exchange_state->e_packet[5] = 0;
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 6);
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending KEX packet %d",
                       (int) packet_type_init);
        exchange_state->state = libssh2_NB_state_created;
    }

    if (exchange_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, exchange_state->e_packet,
                                     exchange_state->e_packet_len,
                                     NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send KEX init message");
            goto clean_exit;
        }
        exchange_state->state = libssh2_NB_state_sent;
    }

    if (exchange_state->state == libssh2_NB_state_sent) {
        if (session->burn_optimistic_kexinit) {
            /* The first KEX packet to come along will be the guess initially
             * sent by the server.  That guess turned out to be wrong so we
             * need to silently ignore it */
            int burn_type;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Waiting for badly guessed KEX packet (to be ignored)");
            burn_type =
                _libssh2_packet_burn(session, &exchange_state->burn_state);
            if (burn_type == LIBSSH2_ERROR_EAGAIN) {
                return burn_type;
            } else if (burn_type <= 0) {
                /* Failed to receive a packet */
                ret = burn_type;
                goto clean_exit;
            }
            session->burn_optimistic_kexinit = 0;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Burnt packet of type: %02x",
                           (unsigned int) burn_type);
        }

        exchange_state->state = libssh2_NB_state_sent1;
    }

    if (exchange_state->state == libssh2_NB_state_sent1) {
        /* Wait for KEX reply */
        rc = _libssh2_packet_require(session, packet_type_reply,
                                     &exchange_state->s_packet,
                                     &exchange_state->s_packet_len, 0, NULL,
                                     0, &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        if (rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_TIMEOUT,
                                 "Timed out waiting for KEX reply");
            goto clean_exit;
        }

        /* Parse KEXDH_REPLY */
        exchange_state->s = exchange_state->s_packet + 1;

        session->server_hostkey_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;

        if (session->server_hostkey)
            LIBSSH2_FREE(session, session->server_hostkey);

        session->server_hostkey =
            LIBSSH2_ALLOC(session, session->server_hostkey_len);
        if (!session->server_hostkey) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host key");
            goto clean_exit;
        }
        memcpy(session->server_hostkey, exchange_state->s,
               session->server_hostkey_len);
        exchange_state->s += session->server_hostkey_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if (libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if (libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;

            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */

        if (session->hostkey->init(session, session->server_hostkey,
                                   session->server_hostkey_len,
                                   &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer");
            goto clean_exit;
        }

        exchange_state->f_value_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->f_value = exchange_state->s;
        exchange_state->s += exchange_state->f_value_len;
        _libssh2_bn_from_bin(exchange_state->f, exchange_state->f_value_len,
                             exchange_state->f_value);

        exchange_state->h_sig_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->h_sig = exchange_state->s;

        /* Compute the shared secret */
        _libssh2_bn_mod_exp(exchange_state->k, exchange_state->f,
                            exchange_state->x, p, exchange_state->ctx);
        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
            LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if (!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         exchange_state->k_value_len - 4);
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        } else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        exchange_state->exchange_hash = (void*)&exchange_hash_ctx;
        libssh2_sha1_init(&exchange_hash_ctx);

        if (session->local.banner) {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             strlen((char *) session->local.banner) - 2);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                (char *) session->local.banner,
                                strlen((char *) session->local.banner) - 2);
        } else {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                LIBSSH2_SSH_DEFAULT_BANNER,
                                sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
        }

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         strlen((char *) session->remote.banner));
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.banner,
                            strlen((char *) session->remote.banner));

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->local.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->local.kexinit,
                            session->local.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->remote.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.kexinit,
                            session->remote.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->server_hostkey_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->server_hostkey,
                            session->server_hostkey_len);

        if (packet_type_init == SSH_MSG_KEX_DH_GEX_INIT) {
            /* diffie-hellman-group-exchange hashes additional fields */
#ifdef LIBSSH2_DH_GEX_NEW
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_MINGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 4,
                             LIBSSH2_DH_GEX_OPTGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 8,
                             LIBSSH2_DH_GEX_MAXGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 12);
#else
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_OPTGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
#endif
        }

        if (midhash) {
            libssh2_sha1_update(exchange_hash_ctx, midhash,
                                midhash_len);
        }

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->e_packet + 1,
                            exchange_state->e_packet_len - 1);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         exchange_state->f_value_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->f_value,
                            exchange_state->f_value_len);

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->k_value,
                            exchange_state->k_value_len);

        libssh2_sha1_final(exchange_hash_ctx,
                           exchange_state->h_sig_comp);

        if (session->hostkey->
            sig_verify(session, exchange_state->h_sig,
                       exchange_state->h_sig_len, exchange_state->h_sig_comp,
                       20, &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature");
            goto clean_exit;
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending NEWKEYS message");
        exchange_state->c = SSH_MSG_NEWKEYS;

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if (exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Unable to send NEWKEYS message");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent3;
    }

    if (exchange_state->state == libssh2_NB_state_sent3) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Timed out waiting for NEWKEYS");
            goto clean_exit;
        }
        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Received NEWKEYS message");

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if (!session->session_id) {
            session->session_id = LIBSSH2_ALLOC(session, SHA_DIGEST_LENGTH);
            if (!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   SHA_DIGEST_LENGTH);
            session->session_id_len = SHA_DIGEST_LENGTH;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "session_id calculated");
        }

        /* Cleanup any existing cipher */
        if (session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if (session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->local.crypt->
                                                        iv_len, "A");
            if (!iv) {
                ret = -1;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->local.crypt->
                                                        secret_len, "C");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated");

        if (session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if (session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->remote.crypt->
                                                        iv_len, "B");
            if (!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->remote.crypt->
                                                        secret_len, "D");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated");

        if (session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if (session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->local.mac->
                                                        key_len, "E");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if (free_key) {
                memset(key, 0, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated");

        if (session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if (session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->remote.mac->
                                                        key_len, "F");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if (free_key) {
                memset(key, 0, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated");

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if (session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if (session->local.comp && session->local.comp->init) {
            if (session->local.comp->init(session, 1,
                                          &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized");

        if (session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if (session->remote.comp && session->remote.comp->init) {
            if (session->remote.comp->init(session, 0,
                                           &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized");

    }

  clean_exit:
    _libssh2_bn_free(exchange_state->x);
    exchange_state->x = NULL;
    _libssh2_bn_free(exchange_state->e);
    exchange_state->e = NULL;
    _libssh2_bn_free(exchange_state->f);
    exchange_state->f = NULL;
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;
    _libssh2_bn_ctx_free(exchange_state->ctx);
    exchange_state->ctx = NULL;

    if (exchange_state->e_packet) {
        LIBSSH2_FREE(session, exchange_state->e_packet);
        exchange_state->e_packet = NULL;
    }

    if (exchange_state->s_packet) {
        LIBSSH2_FREE(session, exchange_state->s_packet);
        exchange_state->s_packet = NULL;
    }

    if (exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}